

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void * bc_trie_lookup(bc_trie_t *trie,char *key)

{
  bc_trie_node_t *local_30;
  bc_trie_node_t *tmp;
  bc_trie_node_t *parent;
  char *key_local;
  bc_trie_t *trie_local;
  
  if (((trie == (bc_trie_t *)0x0) || (trie->root == (bc_trie_node_t *)0x0)) || (key == (char *)0x0))
  {
    return (void *)0x0;
  }
  tmp = trie->root;
  parent = (bc_trie_node_t *)key;
  do {
    for (local_30 = tmp; local_30 != (bc_trie_node_t *)0x0; local_30 = local_30->next) {
      if (local_30->key == parent->key) {
        if (local_30->key == '\0') {
          return local_30->data;
        }
        tmp = local_30->child;
        break;
      }
    }
    if (local_30 == (bc_trie_node_t *)0x0) {
      return (void *)0x0;
    }
    if (parent->key == '\0') {
      return (void *)0x0;
    }
    parent = (bc_trie_node_t *)&parent->field_0x1;
  } while( true );
}

Assistant:

void*
bc_trie_lookup(bc_trie_t *trie, const char *key)
{
    if (trie == NULL || trie->root == NULL || key == NULL)
        return NULL;

    bc_trie_node_t *parent = trie->root;
    bc_trie_node_t *tmp;
    while (1) {
        for (tmp = parent; tmp != NULL; tmp = tmp->next) {

            if (tmp->key == *key) {
                if (tmp->key == '\0')
                    return tmp->data;
                parent = tmp->child;
                break;
            }
        }
        if (tmp == NULL)
            return NULL;

        if (*key == '\0')
            break;
        key++;
    }
    return NULL;
}